

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_div(DisasContext_conflict1 *s,_Bool is_signed,uint sf,uint rm,uint rn,uint rd)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 pTVar1;
  code *func;
  TCGTemp *local_48;
  TCGv_i64 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  ret = cpu_reg_aarch64(s,rd);
  if (sf == 0 && is_signed) {
    ret_00 = new_tmp_a64_aarch64(s);
    local_40 = new_tmp_a64_aarch64(s);
    pTVar1 = cpu_reg_aarch64(s,rn);
    tcg_gen_ext32s_i64_aarch64(tcg_ctx,ret_00,pTVar1);
    pTVar1 = cpu_reg_aarch64(s,rm);
    tcg_gen_ext32s_i64_aarch64(tcg_ctx,local_40,pTVar1);
  }
  else {
    ret_00 = read_cpu_reg_aarch64(s,rn,sf);
    local_40 = read_cpu_reg_aarch64(s,rm,sf);
  }
  local_48 = (TCGTemp *)(ret_00 + (long)tcg_ctx);
  local_40 = local_40 + (long)tcg_ctx;
  if (is_signed) {
    func = helper_sdiv64_aarch64;
  }
  else {
    func = helper_udiv64_aarch64;
  }
  tcg_gen_callN_aarch64(tcg_ctx,func,(TCGTemp *)(ret + (long)&tcg_ctx->pool_cur),2,&local_48);
  if (sf == 0) {
    tcg_gen_ext32u_i64_aarch64(tcg_ctx,ret,ret);
  }
  return;
}

Assistant:

static void handle_div(DisasContext *s, bool is_signed, unsigned int sf,
                       unsigned int rm, unsigned int rn, unsigned int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i64 tcg_n, tcg_m, tcg_rd;
    tcg_rd = cpu_reg(s, rd);

    if (!sf && is_signed) {
        tcg_n = new_tmp_a64(s);
        tcg_m = new_tmp_a64(s);
        tcg_gen_ext32s_i64(tcg_ctx, tcg_n, cpu_reg(s, rn));
        tcg_gen_ext32s_i64(tcg_ctx, tcg_m, cpu_reg(s, rm));
    } else {
        tcg_n = read_cpu_reg(s, rn, sf);
        tcg_m = read_cpu_reg(s, rm, sf);
    }

    if (is_signed) {
        gen_helper_sdiv64(tcg_ctx, tcg_rd, tcg_n, tcg_m);
    } else {
        gen_helper_udiv64(tcg_ctx, tcg_rd, tcg_n, tcg_m);
    }

    if (!sf) { /* zero extend final result */
        tcg_gen_ext32u_i64(tcg_ctx, tcg_rd, tcg_rd);
    }
}